

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,BlockStatementSyntax *syntax)

{
  NamedBlockClauseSyntax *pNVar1;
  StatementBlockKind SVar2;
  SourceLocation loc_00;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar3;
  string_view name_00;
  pointer local_c0;
  size_type local_b8;
  _Storage<slang::ast::VariableLifetime,_true> local_b0 [2];
  Info *local_a8;
  SourceLocation local_a0;
  size_t local_98;
  StatementBlockSymbol *local_90;
  StatementBlockSymbol *result;
  SourceLocation local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_70;
  SourceLocation local_58;
  string_view local_50;
  undefined1 local_40 [8];
  Token token;
  SourceLocation loc;
  string_view name;
  BlockStatementSyntax *syntax_local;
  Scope *scope_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&loc);
  SourceLocation::SourceLocation((SourceLocation *)&token.info);
  if (syntax->blockName == (NamedBlockClauseSyntax *)0x0) {
    local_78 = parsing::Token::location(&syntax->begin);
    getLabel(&local_70,&syntax->super_StatementSyntax,local_78);
    std::tie<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
              ((basic_string_view<char,_std::char_traits<char>_> *)&result,&loc);
    std::tuple<std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>::
    operator=((tuple<std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&> *)
              &result,&local_70);
  }
  else {
    pNVar1 = syntax->blockName;
    local_40._0_2_ = (pNVar1->name).kind;
    local_40[2] = (pNVar1->name).field_0x2;
    local_40[3] = (pNVar1->name).numFlags.raw;
    local_40._4_4_ = (pNVar1->name).rawLen;
    token._0_8_ = (pNVar1->name).info;
    local_50 = parsing::Token::valueText((Token *)local_40);
    loc = (SourceLocation)local_50._M_len;
    name._M_len = (size_t)local_50._M_str;
    local_58 = parsing::Token::location((Token *)local_40);
    token.info = (Info *)local_58;
  }
  local_a0 = loc;
  local_98 = name._M_len;
  local_a8 = token.info;
  SVar2 = SemanticFacts::getStatementBlockKind(syntax);
  std::optional<slang::ast::VariableLifetime>::optional
            ((optional<slang::ast::VariableLifetime> *)local_b0);
  loc_00._4_4_ = 0;
  loc_00._0_4_ = SVar2;
  name_00._M_str = (char *)local_a8;
  name_00._M_len = local_98;
  local_90 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)local_a0,name_00,loc_00,
                         local_b0[0]._M_value,(optional<slang::ast::VariableLifetime>)scope);
  sVar3 = Statement::createAndAddBlockItems(&local_90->super_Scope,&syntax->items);
  local_c0 = sVar3.data_;
  (local_90->blocks).data_ = local_c0;
  local_b8 = sVar3.size_;
  (local_90->blocks).size_ = local_b8;
  return local_90;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const BlockStatementSyntax& syntax) {
    string_view name;
    SourceLocation loc;
    if (syntax.blockName) {
        auto token = syntax.blockName->name;
        name = token.valueText();
        loc = token.location();
    }
    else {
        std::tie(name, loc) = getLabel(syntax, syntax.begin.location());
    }

    auto result = createBlock(scope, syntax, name, loc,
                              SemanticFacts::getStatementBlockKind(syntax));

    result->blocks = Statement::createAndAddBlockItems(*result, syntax.items);
    return *result;
}